

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O3

void write_colored_text(string *message,Color color)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[1;",4);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,color);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"m",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[0m",4);
  return;
}

Assistant:

void write_colored_text(const string &message, Color color) {
    // NOTE: Color is an enum I defined in the beginning of this file

    /*
     * Note: I initially declared the parameter to pass like:
     *            write_colored_text(string message) {...}
     * That worked fine,but CLion complained:
     *            "Clang-Tidy: The parameter 'message' is copied for each invocation but only used as a const reference;
     *            consider making it a const reference."
     * With auto-refactoring by CLion, it was changed to a const reference:
     *            write_colored_text(const string &message) {...}
     */

    // Setting terminal color/options:
    cout << "\033[1;" << int(color) << "m";
    cout << message;
    // Reset terminal color/options:
    cout << "\033[0m";
}